

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

void __thiscall xercesc_4_0::ElemStack::addPrefix(ElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  StackElem *toExpand;
  PrefMapElem *pPVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  XMLSize_t XVar6;
  EmptyStackException *this_00;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar7;
  XMLCh *pXVar8;
  XMLCh XVar9;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0x13a,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,XMLException::~XMLException);
  }
  pRVar1 = (this->fPrefixPool).fHashTable;
  toExpand = this->fStack[this->fStackTop - 1];
  if ((prefixToAdd == (XMLCh *)0x0) || (uVar5 = (ulong)(ushort)*prefixToAdd, uVar5 == 0)) {
    uVar5 = 0;
  }
  else {
    XVar9 = prefixToAdd[1];
    if (XVar9 != L'\0') {
      pXVar8 = prefixToAdd + 2;
      do {
        uVar5 = (ulong)(ushort)XVar9 + (uVar5 >> 0x18) + uVar5 * 0x26;
        XVar9 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar9 != L'\0');
    }
    uVar5 = uVar5 % pRVar1->fHashModulus;
  }
  pRVar7 = pRVar1->fBucketList[uVar5];
  if (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar3 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,prefixToAdd,pRVar7->fKey);
      if (bVar3) {
        if (pRVar7->fData != (PoolElem *)0x0) {
          uVar4 = pRVar7->fData->fId;
          goto LAB_0029bed4;
        }
        break;
      }
      pRVar7 = pRVar7->fNext;
    } while (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  uVar4 = XMLStringPool::addNewEntry(&this->fPrefixPool,prefixToAdd);
LAB_0029bed4:
  XVar6 = toExpand->fMapCount;
  if (XVar6 == toExpand->fMapCapacity) {
    expandMap(this,toExpand);
    XVar6 = toExpand->fMapCount;
  }
  pPVar2 = toExpand->fMap;
  pPVar2[XVar6].fPrefId = uVar4;
  pPVar2[XVar6].fURIId = uriId;
  toExpand->fMapCount = XVar6 + 1;
  return;
}

Assistant:

void ElemStack::addPrefix(  const   XMLCh* const    prefixToAdd
                            , const unsigned int    uriId)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (curRow->fMapCount == curRow->fMapCapacity)
        expandMap(curRow);

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    curRow->fMap[curRow->fMapCount].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        curRow->fMap[curRow->fMapCount].fURIId = fEmptyNamespaceId;
    else
        curRow->fMap[curRow->fMapCount].fURIId = uriId;

    // Bump the map count now
    curRow->fMapCount++;
}